

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailure.cpp
# Opt level: O0

SimpleString __thiscall TestFailure::createUserText(TestFailure *this,SimpleString *text)

{
  undefined1 uVar1;
  undefined1 uVar2;
  byte bVar3;
  SimpleString *in_RDX;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t sVar4;
  SimpleString *in_RDI;
  SimpleString SVar5;
  SimpleString *userMessage;
  undefined6 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9e;
  undefined1 in_stack_ffffffffffffff9f;
  SimpleString *in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffb8;
  SimpleString *in_stack_ffffffffffffffc0;
  
  SimpleString::SimpleString
            (in_stack_ffffffffffffffa0,
             (char *)CONCAT17(in_stack_ffffffffffffff9f,
                              CONCAT16(in_stack_ffffffffffffff9e,in_stack_ffffffffffffff98)));
  uVar1 = SimpleString::isEmpty((SimpleString *)0x17e68b);
  sVar4 = extraout_RDX;
  if (!(bool)uVar1) {
    SimpleString::SimpleString
              (in_RDX,(char *)CONCAT17(in_stack_ffffffffffffff9f,
                                       CONCAT16(in_stack_ffffffffffffff9e,in_stack_ffffffffffffff98)
                                      ));
    uVar2 = SimpleString::startsWith
                      ((SimpleString *)CONCAT17(uVar1,in_stack_ffffffffffffffb8),in_RDI);
    bVar3 = uVar2 ^ 0xff;
    SimpleString::~SimpleString((SimpleString *)0x17e6e5);
    if ((bVar3 & 1) != 0) {
      SimpleString::operator+=
                (in_stack_ffffffffffffffc0,(char *)CONCAT17(uVar1,in_stack_ffffffffffffffb8));
    }
    SimpleString::operator+=
              (in_RDX,(SimpleString *)CONCAT17(uVar2,CONCAT16(bVar3,in_stack_ffffffffffffff98)));
    SimpleString::operator+=
              (in_stack_ffffffffffffffc0,(char *)CONCAT17(uVar1,in_stack_ffffffffffffffb8));
    sVar4 = extraout_RDX_00;
  }
  SVar5.bufferSize_ = sVar4;
  SVar5.buffer_ = (char *)in_RDI;
  return SVar5;
}

Assistant:

SimpleString TestFailure::createUserText(const SimpleString& text)
{
    SimpleString userMessage = "";
    if (!text.isEmpty())
    {
        //This is a kludge to turn off "Message: " for this case.
        //I don't think "Message: " adds anything, as you get to see the
        //message. I propose we remove "Message: " lead in
        if (!text.startsWith("LONGS_EQUAL"))
            userMessage += "Message: ";
        userMessage += text;
        userMessage += "\n\t";
    }
    return userMessage;
}